

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

bool __thiscall
cmsys::SystemInformationImplementation::RetreiveInformationFromCpuInfoFile
          (SystemInformationImplementation *this)

{
  int *piVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  long lVar6;
  ostream *poVar7;
  ulonglong uVar8;
  uint uVar9;
  size_t index;
  ulong uVar10;
  float fVar11;
  string cpuflags;
  string buffer;
  string cpurev;
  string familyStr;
  vector<const_char_*,_std::allocator<const_char_*>_> cachename;
  string CPUSpeed;
  string cores;
  string idc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  __stream = fopen64("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Problem opening /proc/cpuinfo");
    std::endl<char,std::char_traits<char>>(poVar7);
    goto LAB_00408914;
  }
  while (iVar4 = feof(__stream), iVar4 == 0) {
    fgetc(__stream);
    std::__cxx11::string::push_back((char)&buffer);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&buffer);
  while (lVar6 = std::__cxx11::string::find((char *)&buffer,0x4dbdcf), lVar6 != -1) {
    this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
  }
  std::__cxx11::string::string((string *)&local_b0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&idc,this,&local_b0,"physical id",0);
  std::__cxx11::string::~string((string *)&local_b0);
  iVar4 = -1;
  while (this->CurrentPositionInFile != 0xffffffffffffffff) {
    iVar5 = atoi(idc._M_dataplus._M_p);
    if (iVar4 < iVar5) {
      iVar4 = iVar5;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cores,this,&local_50,"physical id",this->CurrentPositionInFile + 1)
    ;
    std::__cxx11::string::operator=((string *)&idc,(string *)&cores);
    std::__cxx11::string::~string((string *)&cores);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)&local_d0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cores,this,&local_d0,"cpu cores",0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (iVar4 < 1) {
    std::__cxx11::string::string((string *)&local_f0,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&CPUSpeed,this,&local_f0,"ncpus active",0);
    uVar9 = atoi(CPUSpeed._M_dataplus._M_p);
    this->NumberOfPhysicalCPU = uVar9;
    std::__cxx11::string::~string((string *)&CPUSpeed);
    std::__cxx11::string::~string((string *)&local_f0);
    uVar9 = this->NumberOfPhysicalCPU;
  }
  else {
    iVar5 = atoi(cores._M_dataplus._M_p);
    uVar9 = (iVar4 + 1) * iVar5;
    this->NumberOfPhysicalCPU = uVar9;
  }
  uVar10 = (ulong)uVar9;
  if (uVar9 == 0) {
    this->NumberOfPhysicalCPU = 1;
    uVar10 = 1;
  }
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
       (uint)(this->NumberOfLogicalCPU / uVar10);
  std::__cxx11::string::string((string *)&local_110,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&CPUSpeed,this,&local_110,"cpu MHz",0);
  std::__cxx11::string::~string((string *)&local_110);
  if (CPUSpeed._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_130,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&familyStr,this,&local_130,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&CPUSpeed,(string *)&familyStr);
    std::__cxx11::string::~string((string *)&familyStr);
    std::__cxx11::string::~string((string *)&local_130);
    uVar8 = strtoull(CPUSpeed._M_dataplus._M_p,(char **)0x0,0x10);
    fVar11 = (float)uVar8 / 1e+06;
  }
  else {
    dVar2 = atof(CPUSpeed._M_dataplus._M_p);
    fVar11 = (float)dVar2;
  }
  this->CPUSpeedInMHz = fVar11;
  std::__cxx11::string::string((string *)&local_150,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&familyStr,this,&local_150,"cpu family",0);
  std::__cxx11::string::~string((string *)&local_150);
  if (familyStr._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_170,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpurev,this,&local_170,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&familyStr,(string *)&cpurev);
    std::__cxx11::string::~string((string *)&cpurev);
    std::__cxx11::string::~string((string *)&local_170);
  }
  iVar4 = atoi(familyStr._M_dataplus._M_p);
  (this->ChipID).Family = iVar4;
  std::__cxx11::string::string((string *)&local_190,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpurev,this,&local_190,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&cpurev);
  std::__cxx11::string::~string((string *)&cpurev);
  std::__cxx11::string::~string((string *)&local_190);
  FindManufacturer(this,&familyStr);
  if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
    bVar3 = std::operator==(&familyStr,"PA-RISC 1.1a");
    iVar4 = 0x11a;
    if (!bVar3) {
      bVar3 = std::operator==(&familyStr,"PA-RISC 2.0");
      iVar4 = 0x200;
      if (!bVar3) goto LAB_004083be;
    }
    (this->ChipID).Family = iVar4;
  }
LAB_004083be:
  std::__cxx11::string::string((string *)&local_1b0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpurev,this,&local_1b0,"model",0);
  iVar4 = atoi(cpurev._M_dataplus._M_p);
  (this->ChipID).Model = iVar4;
  std::__cxx11::string::~string((string *)&cpurev);
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar3 = RetrieveClassicalCPUIdentity(this);
  if (!bVar3) {
    std::__cxx11::string::string((string *)&local_1d0,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpurev,this,&local_1d0,"cpu",0);
    std::__cxx11::string::~string((string *)&local_1d0);
    if (cpurev._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(this->ChipID).ProcessorName);
    }
    std::__cxx11::string::~string((string *)&cpurev);
  }
  std::__cxx11::string::string((string *)&local_1f0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpurev,this,&local_1f0,"stepping",0);
  std::__cxx11::string::~string((string *)&local_1f0);
  if (cpurev._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_210,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpuflags,this,&local_210,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&cpurev,(string *)&cpuflags);
    std::__cxx11::string::~string((string *)&cpuflags);
    std::__cxx11::string::~string((string *)&local_210);
  }
  iVar4 = atoi(cpurev._M_dataplus._M_p);
  (this->ChipID).Revision = iVar4;
  std::__cxx11::string::string((string *)&local_230,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpuflags,this,&local_230,"model name",0);
  std::__cxx11::string::assign((char *)&(this->ChipID).ModelName);
  std::__cxx11::string::~string((string *)&cpuflags);
  std::__cxx11::string::~string((string *)&local_230);
  cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cpuflags._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cachename,(char **)&cpuflags);
  cpuflags._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cachename,(char **)&cpuflags);
  cpuflags._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cachename,(char **)&cpuflags);
  (this->Features).L1CacheSize = 0;
  for (uVar10 = 0;
      uVar10 < (ulong)((long)cachename.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)cachename.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1) {
    std::__cxx11::string::string((string *)&local_70,(string *)&buffer);
    ExtractValueFromCpuInfoFile
              (&cpuflags,this,&local_70,
               cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10],0);
    std::__cxx11::string::~string((string *)&local_70);
    if (cpuflags._M_string_length != 0) {
      lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbe95);
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)&cpuflags);
        std::__cxx11::string::operator=((string *)&cpuflags,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      iVar4 = atoi(cpuflags._M_dataplus._M_p);
      piVar1 = &(this->Features).L1CacheSize;
      *piVar1 = *piVar1 + iVar4;
    }
    std::__cxx11::string::~string((string *)&cpuflags);
  }
  std::__cxx11::string::string((string *)&local_250,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpuflags,this,&local_250,"flags",0);
  std::__cxx11::string::~string((string *)&local_250);
  if (cpurev._M_string_length != 0) {
    std::operator+(&local_270," ",&cpuflags);
    std::operator+(&local_90,&local_270," ");
    std::__cxx11::string::operator=((string *)&cpuflags,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_270);
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbe99);
    if (lVar6 != -1) {
      (this->Features).HasFPU = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbe9f);
    if (lVar6 != -1) {
      (this->Features).HasTSC = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbea5);
    if (lVar6 != -1) {
      (this->Features).HasMMX = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbeab);
    if (lVar6 != -1) {
      (this->Features).HasSSE = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbeb1);
    if (lVar6 != -1) {
      (this->Features).HasSSE2 = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbeb8);
    if (lVar6 != -1) {
      (this->Features).HasAPIC = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbebf);
    if (lVar6 != -1) {
      (this->Features).HasCMOV = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbec6);
    if (lVar6 != -1) {
      (this->Features).HasMTRR = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbecd);
    if (lVar6 != -1) {
      (this->Features).HasACPI = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&cpuflags,0x4dbed4);
    if (lVar6 != -1) {
      (this->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  std::__cxx11::string::~string((string *)&cpuflags);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::__cxx11::string::~string((string *)&cpurev);
  std::__cxx11::string::~string((string *)&familyStr);
  std::__cxx11::string::~string((string *)&CPUSpeed);
  std::__cxx11::string::~string((string *)&cores);
  std::__cxx11::string::~string((string *)&idc);
LAB_00408914:
  std::__cxx11::string::~string((string *)&buffer);
  return __stream != (FILE *)0x0;
}

Assistant:

bool SystemInformationImplementation::RetreiveInformationFromCpuInfoFile()
{
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  std::string buffer;

  FILE *fd = fopen("/proc/cpuinfo", "r" );
  if ( !fd )
    {
    std::cout << "Problem opening /proc/cpuinfo" << std::endl;
    return false;
    }

  size_t fileSize = 0;
  while(!feof(fd))
    {
    buffer += static_cast<char>(fgetc(fd));
    fileSize++;
    }
  fclose( fd );
  buffer.resize(fileSize-2);
  // Number of logical CPUs (combination of multiple processors, multi-core
  // and hyperthreading)
  size_t pos = buffer.find("processor\t");
  while(pos != buffer.npos)
    {
    this->NumberOfLogicalCPU++;
    pos = buffer.find("processor\t",pos+1);
    }

#ifdef __linux
  // Find the largest physical id.
  int maxId = -1;
  std::string idc =
                       this->ExtractValueFromCpuInfoFile(buffer,"physical id");
  while(this->CurrentPositionInFile != buffer.npos)
    {
      int id = atoi(idc.c_str());
      if(id > maxId)
      {
       maxId=id;
      }
    idc = this->ExtractValueFromCpuInfoFile(buffer,"physical id",
                                            this->CurrentPositionInFile+1);
    }
  // Physical ids returned by Linux don't distinguish cores.
  // We want to record the total number of cores in this->NumberOfPhysicalCPU
  // (checking only the first proc)
  std::string cores =
                        this->ExtractValueFromCpuInfoFile(buffer,"cpu cores");
  int numberOfCoresPerCPU=atoi(cores.c_str());
  if (maxId > 0)
    {
    this->NumberOfPhysicalCPU=static_cast<unsigned int>(
      numberOfCoresPerCPU*(maxId+1));
    }
  else
    {
    // Linux Sparc: get cpu count
    this->NumberOfPhysicalCPU=
            atoi(this->ExtractValueFromCpuInfoFile(buffer,"ncpus active").c_str());
    }

#else // __CYGWIN__
  // does not have "physical id" entries, neither "cpu cores"
  // this has to be fixed for hyper-threading.
  std::string cpucount =
    this->ExtractValueFromCpuInfoFile(buffer,"cpu count");
  this->NumberOfPhysicalCPU=
    this->NumberOfLogicalCPU = atoi(cpucount.c_str());
#endif
  // gotta have one, and if this is 0 then we get a / by 0n
  // better to have a bad answer than a crash
  if(this->NumberOfPhysicalCPU <= 0)
    {
    this->NumberOfPhysicalCPU = 1;
    }
  // LogicalProcessorsPerPhysical>1 => hyperthreading.
  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical=
      this->NumberOfLogicalCPU/this->NumberOfPhysicalCPU;

  // CPU speed (checking only the first processor)
  std::string CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer,"cpu MHz");
  if(!CPUSpeed.empty())
    {
    this->CPUSpeedInMHz = static_cast<float>(atof(CPUSpeed.c_str()));
    }
#ifdef __linux
  else
    {
    // Linux Sparc: CPU speed is in Hz and encoded in hexadecimal
    CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer,"Cpu0ClkTck");
    this->CPUSpeedInMHz = static_cast<float>(
                                 strtoull(CPUSpeed.c_str(),0,16))/1000000.0f;
    }
#endif

  // Chip family
  std::string familyStr =
    this->ExtractValueFromCpuInfoFile(buffer,"cpu family");
  if(familyStr.empty())
    {
    familyStr = this->ExtractValueFromCpuInfoFile(buffer,"CPU architecture");
    }
  this->ChipID.Family = atoi(familyStr.c_str());

  // Chip Vendor
  this->ChipID.Vendor = this->ExtractValueFromCpuInfoFile(buffer,"vendor_id");
  this->FindManufacturer(familyStr);

  // second try for setting family
  if (this->ChipID.Family == 0 && this->ChipManufacturer == HP)
    {
    if (familyStr == "PA-RISC 1.1a")
      this->ChipID.Family = 0x11a;
    else if (familyStr == "PA-RISC 2.0")
      this->ChipID.Family = 0x200;
    // If you really get CMake to work on a machine not belonging to
    // any of those families I owe you a dinner if you get it to
    // contribute nightly builds regularly.
    }

  // Chip Model
  this->ChipID.Model = atoi(this->ExtractValueFromCpuInfoFile(buffer,"model").c_str());
  if(!this->RetrieveClassicalCPUIdentity())
    {
    // Some platforms (e.g. PA-RISC) tell us their CPU name here.
    // Note: x86 does not.
    std::string cpuname = this->ExtractValueFromCpuInfoFile(buffer,"cpu");
    if(!cpuname.empty())
      {
      this->ChipID.ProcessorName = cpuname;
      }
    }

  // Chip revision
  std::string cpurev = this->ExtractValueFromCpuInfoFile(buffer,"stepping");
  if(cpurev.empty())
    {
    cpurev = this->ExtractValueFromCpuInfoFile(buffer,"CPU revision");
    }
  this->ChipID.Revision = atoi(cpurev.c_str());

  // Chip Model Name
  this->ChipID.ModelName = this->ExtractValueFromCpuInfoFile(buffer,"model name").c_str();

  // L1 Cache size
  // Different architectures may show different names for the caches.
  // Sum up everything we find.
  std::vector<const char*> cachename;
  cachename.clear();

  cachename.push_back("cache size"); // e.g. x86
  cachename.push_back("I-cache"); // e.g. PA-RISC
  cachename.push_back("D-cache"); // e.g. PA-RISC

  this->Features.L1CacheSize = 0;
  for (size_t index = 0; index < cachename.size(); index ++)
    {
    std::string cacheSize = this->ExtractValueFromCpuInfoFile(buffer,cachename[index]);
    if (!cacheSize.empty())
      {
      pos = cacheSize.find(" KB");
      if(pos!=cacheSize.npos)
        {
        cacheSize = cacheSize.substr(0,pos);
        }
      this->Features.L1CacheSize += atoi(cacheSize.c_str());
      }
    }

  // processor feature flags (probably x86 specific)
  std::string cpuflags = this->ExtractValueFromCpuInfoFile(buffer,"flags");
  if(!cpurev.empty())
    {
    // now we can match every flags as space + flag + space
    cpuflags = " " + cpuflags + " ";
    if ((cpuflags.find(" fpu ")!=std::string::npos))
      {
      this->Features.HasFPU = true;
      }
    if ((cpuflags.find(" tsc ")!=std::string::npos))
      {
      this->Features.HasTSC = true;
      }
    if ((cpuflags.find(" mmx ")!=std::string::npos))
      {
      this->Features.HasMMX = true;
      }
    if ((cpuflags.find(" sse ")!=std::string::npos))
      {
      this->Features.HasSSE = true;
      }
    if ((cpuflags.find(" sse2 ")!=std::string::npos))
      {
      this->Features.HasSSE2 = true;
      }
    if ((cpuflags.find(" apic ")!=std::string::npos))
      {
      this->Features.HasAPIC = true;
      }
    if ((cpuflags.find(" cmov ")!=std::string::npos))
      {
      this->Features.HasCMOV = true;
      }
    if ((cpuflags.find(" mtrr ")!=std::string::npos))
      {
      this->Features.HasMTRR = true;
      }
    if ((cpuflags.find(" acpi ")!=std::string::npos))
      {
      this->Features.HasACPI = true;
      }
    if ((cpuflags.find(" 3dnow ")!=std::string::npos))
      {
      this->Features.ExtendedFeatures.Has3DNow = true;
      }
    }

  return true;
}